

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

void __thiscall
leveldb::Iterator::RegisterCleanup(Iterator *this,CleanupFunction func,void *arg1,void *arg2)

{
  long lVar1;
  CleanupNode *pCVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (func == (CleanupFunction)0x0) {
    __assert_fail("func != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator.cc"
                  ,0x1b,"void leveldb::Iterator::RegisterCleanup(CleanupFunction, void *, void *)");
  }
  if ((this->cleanup_head_).function == (CleanupFunction)0x0) {
    pCVar2 = &this->cleanup_head_;
  }
  else {
    pCVar2 = (CleanupNode *)operator_new(0x20);
    pCVar2->function = (CleanupFunction)0x0;
    pCVar2->arg1 = (void *)0x0;
    pCVar2->arg2 = (void *)0x0;
    pCVar2->next = (CleanupNode *)0x0;
    pCVar2->next = (this->cleanup_head_).next;
    (this->cleanup_head_).next = pCVar2;
  }
  pCVar2->function = func;
  pCVar2->arg1 = arg1;
  pCVar2->arg2 = arg2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Iterator::RegisterCleanup(CleanupFunction func, void* arg1, void* arg2) {
  assert(func != nullptr);
  CleanupNode* node;
  if (cleanup_head_.IsEmpty()) {
    node = &cleanup_head_;
  } else {
    node = new CleanupNode();
    node->next = cleanup_head_.next;
    cleanup_head_.next = node;
  }
  node->function = func;
  node->arg1 = arg1;
  node->arg2 = arg2;
}